

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int unqlite_result_double(unqlite_context *pCtx,double Value)

{
  jx9_result_double(pCtx,Value);
  return 0;
}

Assistant:

int unqlite_result_double(unqlite_context *pCtx, double Value)
{
	return jx9_result_double(pCtx,Value);
}